

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_types.cc
# Opt level: O0

void Typelib::CXX::addStandardTypes(Registry *registry)

{
  Registry *pRVar1;
  Registry *pRVar2;
  byte bVar3;
  string *this;
  Type *on;
  allocator local_b9;
  string local_b8 [38];
  undefined1 local_92;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  Registry *local_10;
  Registry *registry_local;
  
  local_10 = registry;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"/bool",&local_31);
  bVar3 = Typelib::Registry::has((string *)registry,SUB81(local_30,0));
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (((bVar3 ^ 0xff) & 1) != 0) {
    ::addStandardTypes(local_10);
  }
  pRVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"/std/string",&local_69);
  bVar3 = Typelib::Registry::has((string *)pRVar1,SUB81(local_68,0));
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  pRVar1 = local_10;
  if (((bVar3 ^ 0xff) & 1) != 0) {
    this = (string *)operator_new(0x68);
    pRVar2 = local_10;
    local_92 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"/int8_t",&local_91);
    on = (Type *)Typelib::Registry::get((string *)pRVar2);
    String::String((String *)this,on);
    local_92 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"",&local_b9);
    Typelib::Registry::add((Type *)pRVar1,this);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  return;
}

Assistant:

void Typelib::CXX::addStandardTypes(Typelib::Registry& registry)
{
    if (!registry.has("/bool"))
        ::addStandardTypes(registry);
    if (!registry.has("/std/string"))
        registry.add(new String(*registry.get("/int8_t")));
}